

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O0

void __thiscall
ConvertorPCM2WAV::ConvertorPCM2WAV
          (ConvertorPCM2WAV *this,PBuffer *_buffer,size_t _chenals,size_t _rate)

{
  shared_ptr<Buffer> local_38;
  size_t local_28;
  size_t _rate_local;
  size_t _chenals_local;
  PBuffer *_buffer_local;
  ConvertorPCM2WAV *this_local;
  
  local_28 = _rate;
  _rate_local = _chenals;
  _chenals_local = (size_t)_buffer;
  _buffer_local = (PBuffer *)this;
  std::shared_ptr<Buffer>::shared_ptr(&local_38,_buffer);
  Convertor::Convertor(&this->super_Convertor,&local_38);
  std::shared_ptr<Buffer>::~shared_ptr(&local_38);
  (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__ConvertorPCM2WAV_001a5c08;
  std::shared_ptr<MutableBuffer>::shared_ptr(&this->result);
  this->chenals = _rate_local;
  this->rate = local_28;
  return;
}

Assistant:

ConvertorPCM2WAV::ConvertorPCM2WAV(PBuffer _buffer,
                                   size_t _chenals,
                                   size_t _rate)
  : Convertor(_buffer)
  , chenals(_chenals)
  , rate(_rate) {
}